

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O1

void __thiscall mjs::while_statement::~while_statement(while_statement *this)

{
  statement *psVar1;
  expression *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__while_statement_001d95e8;
  psVar1 = (this->s_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 != (statement *)0x0) {
    (**(code **)((long)(psVar1->super_syntax_node)._vptr_syntax_node + 8))();
  }
  (this->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl = (statement *)0x0;
  peVar2 = (this->cond_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if (peVar2 != (expression *)0x0) {
    (**(code **)((long)(peVar2->super_syntax_node)._vptr_syntax_node + 8))();
  }
  (this->cond_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__syntax_node_001d9120;
  this_00 = (this->super_statement).super_syntax_node.extend_.file.
            super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit while_statement(const source_extend& extend, expression_ptr&& cond, statement_ptr&& s) : statement(extend), cond_(std::move(cond)), s_(std::move(s)) {
        assert(cond_);
        assert(s_);
    }